

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alListener3i(void)

{
  ALenum param_00;
  int32 value1_00;
  int32 value2_00;
  int32 value3_00;
  ALint value3;
  ALint value2;
  ALint value1;
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&value1);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    value1_00 = IO_INT32();
    value2_00 = IO_INT32();
    value3_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alListener3i((CallerInfo *)&value1,param_00,value1_00,value2_00,value3_00);
    }
  }
  return;
}

Assistant:

static void decode_alListener3i(void)
{
    IO_START(alListener3i);
    const ALenum param = IO_ENUM();
    const ALint value1 = IO_INT32();
    const ALint value2 = IO_INT32();
    const ALint value3 = IO_INT32();
    if (!io_failure) visit_alListener3i(&callerinfo, param, value1, value2, value3);
    IO_END();
}